

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void kwsysProcessesSignalHandler(int signum,siginfo_t *info,void *ucontext)

{
  cmsysProcess *pcVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  bool bVar5;
  undefined1 local_168 [8];
  sigset_t unblockSet;
  sigaction defSigAction;
  cmsysProcess *cp_1;
  kwsysProcess_ssize_t pipeStatus;
  cmsysProcess *cp;
  int local_30;
  undefined1 local_2c [3];
  char buf;
  int old_errno;
  int procStatus;
  int j;
  int i;
  void *ucontext_local;
  siginfo_t *info_local;
  int signum_local;
  
  _j = ucontext;
  ucontext_local = info;
  info_local._4_4_ = signum;
  piVar4 = __errno_location();
  local_30 = *piVar4;
  if ((info_local._4_4_ != 2) && (info_local._4_4_ != 0xf)) {
    if (info_local._4_4_ == 0x11) {
      for (procStatus = 0; procStatus < kwsysProcesses.Count; procStatus = procStatus + 1) {
        cp._7_1_ = 1;
        pcVar1 = kwsysProcesses.Processes[procStatus];
        read(pcVar1->PipeReadEnds[2],(void *)((long)&cp + 7),1);
        write(pcVar1->SignalPipe,(void *)((long)&cp + 7),1);
      }
    }
    iVar3 = local_30;
    piVar4 = __errno_location();
    *piVar4 = iVar3;
    return;
  }
  for (procStatus = 0; procStatus < kwsysProcesses.Count; procStatus = procStatus + 1) {
    defSigAction.sa_restorer = (_func_void *)kwsysProcesses.Processes[procStatus];
    if ((((((cmsysProcess *)defSigAction.sa_restorer)->CreateProcessGroup != 0) &&
         (((cmsysProcess *)defSigAction.sa_restorer)->Killed == 0)) &&
        (((cmsysProcess *)defSigAction.sa_restorer)->State != 1)) &&
       (((cmsysProcess *)defSigAction.sa_restorer)->ForkPIDs != (pid_t *)0x0)) {
      for (old_errno = 0; old_errno < *(int *)(defSigAction.sa_restorer + 8);
          old_errno = old_errno + 1) {
        if (*(int *)(*(long *)(defSigAction.sa_restorer + 0x428) + (long)old_errno * 4) != 0) {
          kill(-*(int *)(*(long *)(defSigAction.sa_restorer + 0x428) + (long)old_errno * 4),2);
        }
      }
    }
  }
  do {
    _Var2 = wait(local_2c);
    bVar5 = true;
    if (_Var2 < 0) {
      piVar4 = __errno_location();
      bVar5 = *piVar4 != 10;
    }
  } while (bVar5);
  memset(unblockSet.__val + 0xf,0,0x98);
  unblockSet.__val[0xf] = 0;
  sigemptyset((sigset_t *)&defSigAction);
  do {
    iVar3 = sigaction(info_local._4_4_,(sigaction *)(unblockSet.__val + 0xf),(sigaction *)0x0);
    bVar5 = false;
    if (iVar3 < 0) {
      piVar4 = __errno_location();
      bVar5 = *piVar4 == 4;
    }
  } while (bVar5);
  sigemptyset((sigset_t *)local_168);
  sigaddset((sigset_t *)local_168,info_local._4_4_);
  sigprocmask(1,(sigset_t *)local_168,(sigset_t *)0x0);
  raise(info_local._4_4_);
  _exit(1);
}

Assistant:

static void kwsysProcessesSignalHandler(int signum
#if KWSYSPE_USE_SIGINFO
                                        ,
                                        siginfo_t* info, void* ucontext
#endif
)
{
  int i, j, procStatus, old_errno = errno;
#if KWSYSPE_USE_SIGINFO
  (void)info;
  (void)ucontext;
#endif

  /* Signal all process objects that a child has terminated.  */
  switch (signum) {
    case SIGCHLD:
      for (i = 0; i < kwsysProcesses.Count; ++i) {
        /* Set the pipe in a signalled state.  */
        char buf = 1;
        kwsysProcess* cp = kwsysProcesses.Processes[i];
        kwsysProcess_ssize_t pipeStatus =
          read(cp->PipeReadEnds[KWSYSPE_PIPE_SIGNAL], &buf, 1);
        (void)pipeStatus;
        pipeStatus = write(cp->SignalPipe, &buf, 1);
        (void)pipeStatus;
      }
      break;
    case SIGINT:
    case SIGTERM:
      /* Signal child processes that are running in new process groups.  */
      for (i = 0; i < kwsysProcesses.Count; ++i) {
        kwsysProcess* cp = kwsysProcesses.Processes[i];
        /* Check Killed to avoid data race condition when killing.
           Check State to avoid data race condition in kwsysProcessCleanup
           when there is an error (it leaves a reaped PID).  */
        if (cp->CreateProcessGroup && !cp->Killed &&
            cp->State != kwsysProcess_State_Error && cp->ForkPIDs) {
          for (j = 0; j < cp->NumberOfCommands; ++j) {
            /* Make sure the PID is still valid. */
            if (cp->ForkPIDs[j]) {
              /* The user created a process group for this process.  The group
                 ID
                 is the process ID for the original process in the group.  */
              kill(-cp->ForkPIDs[j], SIGINT);
            }
          }
        }
      }

      /* Wait for all processes to terminate.  */
      while (wait(&procStatus) >= 0 || errno != ECHILD) {
      }

      /* Terminate the process, which is now in an inconsistent state
         because we reaped all the PIDs that it may have been reaping
         or may have reaped in the future.  Reraise the signal so that
         the proper exit code is returned.  */
      {
        /* Install default signal handler.  */
        struct sigaction defSigAction;
        sigset_t unblockSet;
        memset(&defSigAction, 0, sizeof(defSigAction));
        defSigAction.sa_handler = SIG_DFL;
        sigemptyset(&defSigAction.sa_mask);
        while ((sigaction(signum, &defSigAction, 0) < 0) && (errno == EINTR))
          ;
        /* Unmask the signal.  */
        sigemptyset(&unblockSet);
        sigaddset(&unblockSet, signum);
        sigprocmask(SIG_UNBLOCK, &unblockSet, 0);
        /* Raise the signal again.  */
        raise(signum);
        /* We shouldn't get here... but if we do... */
        _exit(1);
      }
      /* break omitted to silence unreachable code clang compiler warning.  */
  }

#if !KWSYSPE_USE_SIGINFO
  /* Re-Install our handler.  Repeat call until it is not interrupted.  */
  {
    struct sigaction newSigAction;
    struct sigaction& oldSigAction;
    memset(&newSigAction, 0, sizeof(struct sigaction));
    newSigChldAction.sa_handler = kwsysProcessesSignalHandler;
    newSigChldAction.sa_flags = SA_NOCLDSTOP;
    sigemptyset(&newSigAction.sa_mask);
    switch (signum) {
      case SIGCHLD:
        oldSigAction = &kwsysProcessesOldSigChldAction;
        break;
      case SIGINT:
        sigaddset(&newSigAction.sa_mask, SIGTERM);
        oldSigAction = &kwsysProcessesOldSigIntAction;
        break;
      case SIGTERM:
        sigaddset(&newSigAction.sa_mask, SIGINT);
        oldSigAction = &kwsysProcessesOldSigTermAction;
        break;
      default:
        return 0;
    }
    while ((sigaction(signum, &newSigAction, oldSigAction) < 0) &&
           (errno == EINTR))
      ;
  }
#endif

  errno = old_errno;
}